

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O3

void __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::get_inlines_info
          (dwarf_resolver *this,die_object *cu_die,die_object *die,Dwarf_Addr pc,
          Dwarf_Half dwversion,
          vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *inlines)

{
  char cVar1;
  Dwarf_Half DVar2;
  char *signature;
  char *expression;
  assert_type type;
  undefined4 uVar3;
  undefined6 in_register_00000082;
  ulong uVar4;
  source_location location;
  die_object current_obj_holder;
  die_object child;
  undefined4 in_stack_ffffffffffffff68;
  die_object local_90;
  Dwarf_Addr local_80;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  undefined1 local_50 [8];
  char local_48;
  die_object local_40;
  
  uVar3 = (undefined4)CONCAT62(in_register_00000082,dwversion);
  local_80 = pc;
  local_78 = inlines;
  DVar2 = die_object::get_tag(die);
  if ((DVar2 == 0x2e) || (DVar2 = die_object::get_tag(die), DVar2 == 0x1d)) {
    local_90.dbg = this->dbg;
    local_90.die = (Dwarf_Die)0x0;
    if (local_90.dbg != (Dwarf_Debug)0x0) {
      do {
        die_object::get_child(&local_40);
        if (local_40.die == (Dwarf_Die)0x0) {
          die_object::~die_object(&local_40);
          break;
        }
        local_48 = '\0';
        local_70._8_8_ = 0;
        local_70._M_unused._M_object = operator_new(0x38);
        *(dwarf_resolver **)local_70._M_unused._0_8_ = this;
        *(die_object **)((long)local_70._M_unused._0_8_ + 8) = cu_die;
        *(Dwarf_Addr *)((long)local_70._M_unused._0_8_ + 0x10) = local_80;
        *(short *)((long)local_70._M_unused._0_8_ + 0x18) = (short)uVar3;
        *(vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> **)
         ((long)local_70._M_unused._0_8_ + 0x20) = local_78;
        *(undefined1 **)((long)local_70._M_unused._0_8_ + 0x28) = local_50;
        *(die_object **)((long)local_70._M_unused._0_8_ + 0x30) = &local_90;
        local_58 = std::
                   _Function_handler<bool_(const_cpptrace::detail::libdwarf::die_object_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp:391:21)>
                   ::_M_invoke;
        local_60 = std::
                   _Function_handler<bool_(const_cpptrace::detail::libdwarf::die_object_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp:391:21)>
                   ::_M_manager;
        walk_die_list(&local_40,
                      (function<bool_(const_cpptrace::detail::libdwarf::die_object_&)> *)&local_70);
        if (local_60 != (code *)0x0) {
          (*local_60)(&local_70,&local_70,__destroy_functor);
        }
        cVar1 = local_48;
        die_object::~die_object(&local_40);
      } while (cVar1 != '\0');
      die_object::~die_object(&local_90);
      return;
    }
    type = 0x18f4ca;
    expression = "cpptrace::detail::libdwarf::die_object::die_object(Dwarf_Debug, Dwarf_Die)";
    signature = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
    ;
    uVar4 = 0x42;
    local_90.dbg = (Dwarf_Debug)0x0;
  }
  else {
    type = 0x190680;
    expression = 
    "void cpptrace::detail::libdwarf::dwarf_resolver::get_inlines_info(const die_object &, const die_object &, Dwarf_Addr, Dwarf_Half, std::vector<stacktrace_frame> &)"
    ;
    signature = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
    ;
    uVar4 = 0x178;
  }
  location._8_8_ = 0;
  location.file = (char *)uVar4;
  assert_fail((detail *)0x0,type,expression,signature,location,
              (char *)CONCAT44(uVar3,in_stack_ffffffffffffff68));
}

Assistant:

void get_inlines_info(
            const die_object& cu_die,
            const die_object& die,
            Dwarf_Addr pc,
            Dwarf_Half dwversion,
            std::vector<stacktrace_frame>& inlines
        ) {
            ASSERT(die.get_tag() == DW_TAG_subprogram || die.get_tag() == DW_TAG_inlined_subroutine);
            // get_inlines_info is recursive and recurses into dies with pc ranges matching the pc we're looking for,
            // however, because I wouldn't want anything stack overflowing I'm breaking the recursion out into a loop
            // while looping when we find the target die we need to be able to store a die somewhere that doesn't die
            // at the end of the list traversal, we'll use this as a holder for it
            die_object current_obj_holder(dbg, nullptr);
            optional<std::reference_wrapper<const die_object>> current_die = die;
            while(current_die.has_value()) {
                auto child = current_die.unwrap().get().get_child();
                if(!child) {
                    break;
                }
                optional<std::reference_wrapper<const die_object>> target_die;
                walk_die_list(
                    child,
                    [this, &cu_die, pc, dwversion, &inlines, &target_die, &current_obj_holder] (const die_object& die) {
                        if(die.get_tag() == DW_TAG_inlined_subroutine && die.pc_in_die(cu_die, dwversion, pc)) {
                            const auto name = subprogram_symbol(die, dwversion);
                            auto file_i = die.get_unsigned_attribute(DW_AT_call_file);
                            // TODO: Refactor.... Probably put logic in resolve_filename.
                            if(file_i) {
                                // for dwarf 2, 3, 4, and experimental line table version 0xfe06 1-indexing is used
                                // for dwarf 5 0-indexing is used
                                optional<std::reference_wrapper<line_table_info>> line_table_opt;
                                if(skeleton) {
                                    line_table_opt = skeleton.unwrap().resolver.get_line_table(
                                        skeleton.unwrap().cu_die
                                    );
                                } else {
                                    line_table_opt = get_line_table(cu_die);
                                }
                                if(line_table_opt) {
                                    auto& line_table = line_table_opt.unwrap().get();
                                    if(line_table.version != 5) {
                                        if(file_i.unwrap() == 0) {
                                            file_i.reset(); // 0 means no name to be found
                                        } else {
                                            // decrement to 0-based index
                                            file_i.unwrap()--;
                                        }
                                    }
                                } else {
                                    // silently continue
                                }
                            }
                            std::string file = file_i ? resolve_filename(cu_die, file_i.unwrap()) : "";
                            const auto line = die.get_unsigned_attribute(DW_AT_call_line);
                            const auto col = die.get_unsigned_attribute(DW_AT_call_column);
                            inlines.push_back(stacktrace_frame{
                                0,
                                0, // TODO: Could put an object address here...
                                {static_cast<std::uint32_t>(line.value_or(0))},
                                {static_cast<std::uint32_t>(col.value_or(0))},
                                file,
                                name,
                                true
                            });
                            current_obj_holder = die.clone();
                            target_die = current_obj_holder;
                            return false;
                        } else {
                            return true;
                        }
                    }
                );
                // recursing into the found target as-if by get_inlines_info(cu_die, die, pc, dwversion, inlines);
                current_die = target_die;
            }
        }